

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O3

void __thiscall MT32Emu::RhythmPart::refresh(RhythmPart *this)

{
  Bit8u BVar1;
  RhythmTemp *pRVar2;
  Synth *pSVar3;
  long lVar4;
  ulong uVar5;
  bool *pbVar6;
  
  pSVar3 = (this->super_Part).synth;
  if (pSVar3->controlROMMap->rhythmSettingsCount != 0) {
    pRVar2 = this->rhythmTemp;
    pbVar6 = &this->drumCache[0][0].reverb;
    uVar5 = 0;
    do {
      if (pRVar2[uVar5].timbre < 0x7f) {
        Part::backupCacheToPartials(&this->super_Part,this->drumCache[uVar5]);
        pRVar2 = this->rhythmTemp;
        BVar1 = pRVar2[uVar5].reverbSwitch;
        lVar4 = 0;
        do {
          pbVar6[lVar4 + -9] = true;
          pbVar6[lVar4] = BVar1 != '\0';
          lVar4 = lVar4 + 0x68;
        } while (lVar4 != 0x1a0);
        pSVar3 = (this->super_Part).synth;
      }
      uVar5 = uVar5 + 1;
      pbVar6 = pbVar6 + 0x1a0;
    } while (uVar5 < pSVar3->controlROMMap->rhythmSettingsCount);
  }
  (this->super_Part).pitchBenderRange =
       (ushort)(((this->super_Part).patchTemp)->patch).benderRange * 0x2ab;
  return;
}

Assistant:

void RhythmPart::refresh() {
	// (Re-)cache all the mapped timbres ahead of time
	for (unsigned int drumNum = 0; drumNum < synth->controlROMMap->rhythmSettingsCount; drumNum++) {
		int drumTimbreNum = rhythmTemp[drumNum].timbre;
		if (drumTimbreNum >= 127) { // 94 on MT-32
			continue;
		}
		PatchCache *cache = drumCache[drumNum];
		backupCacheToPartials(cache);
		for (int t = 0; t < 4; t++) {
			// Common parameters, stored redundantly
			cache[t].dirty = true;
			cache[t].reverb = rhythmTemp[drumNum].reverbSwitch > 0;
		}
	}
	updatePitchBenderRange();
}